

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLinOp::AnyAverageDownAndSync
          (MLNodeLinOp *this,Vector<amrex::Any,_std::allocator<amrex::Any>_> *sol)

{
  int ratio;
  int ncomp;
  FabArray<amrex::FArrayBox> *pFVar1;
  MultiFab *S_fine;
  Periodicity *period;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  FabFactory<amrex::FArrayBox> local_248;
  MFInfo local_240;
  IntVect local_218;
  MultiFab tmpmf;
  
  ncomp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  lVar5 = (long)(this->super_MLLinOp).m_num_amr_levels;
  pFVar1 = &Any::get<amrex::MultiFab>
                      ((sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                       super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar5 + -1)->
            super_FabArray<amrex::FArrayBox>;
  tmpmf.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._0_12_ =
       Geometry::periodicity
                 (*(Geometry **)
                   &(this->super_MLLinOp).m_geom.
                    super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar5 - 1U].
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>);
  FabArray<amrex::FArrayBox>::OverrideSync(pFVar1,(Periodicity *)&tmpmf);
  if (1 < lVar5) {
    uVar2 = lVar5 - 1U & 0xffffffff;
    uVar4 = uVar2 + 1;
    lVar3 = uVar2 << 3;
    lVar5 = uVar2 * 0xc;
    do {
      S_fine = Any::get<amrex::MultiFab>
                         ((Any *)((long)&(((sol->
                                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_ptr)._M_t.
                                         super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                         .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                         _M_head_impl + lVar3));
      pFVar1 = &Any::get<amrex::MultiFab>
                          ((Any *)((long)&(sol->
                                          super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_ptr._M_t.
                                          super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                          .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                          _M_head_impl + lVar3))->super_FabArray<amrex::FArrayBox>;
      ratio = (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [uVar4 - 2];
      amrex::coarsen((BoxArray *)&local_218,
                     &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,ratio);
      local_240.alloc = true;
      local_240._1_7_ = 0;
      local_240.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_240.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_240.arena = (Arena *)0x0;
      local_240.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_248._vptr_FabFactory = (_func_int **)&PTR__FabFactory_0080b918;
      MultiFab::MultiFab((MultiFab *)&tmpmf.super_FabArray<amrex::FArrayBox>,(BoxArray *)&local_218,
                         &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                          distributionMap,ncomp,0,&local_240,&local_248);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_240.tags.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
      BoxArray::~BoxArray((BoxArray *)&local_218);
      average_down(S_fine,(MultiFab *)&tmpmf.super_FabArray<amrex::FArrayBox>,0,ncomp,ratio);
      period = Periodicity::NonPeriodic();
      local_218.vect = (int  [3])ZEXT812(0);
      local_240.alloc = false;
      local_240._1_7_ = 0;
      local_240.arena = (Arena *)((ulong)local_240.arena & 0xffffffff00000000);
      FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                (pFVar1,&tmpmf.super_FabArray<amrex::FArrayBox>,0,0,ncomp,&local_218,
                 (IntVect *)&local_240,period,COPY,(CPC *)0x0,false);
      local_218.vect =
           (int  [3])
           Geometry::periodicity
                     (*(Geometry **)
                       ((long)&(this->super_MLLinOp).m_geom.
                               super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].
                               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar5 * 2));
      FabArray<amrex::FArrayBox>::OverrideSync(pFVar1,(Periodicity *)&local_218);
      MultiFab::~MultiFab((MultiFab *)&tmpmf.super_FabArray<amrex::FArrayBox>);
      uVar4 = uVar4 - 1;
      lVar3 = lVar3 + -8;
      lVar5 = lVar5 + -0xc;
    } while (1 < uVar4);
  }
  return;
}

Assistant:

void
MLNodeLinOp::AnyAverageDownAndSync (Vector<Any>& sol) const
{
    AMREX_ASSERT(sol[0].is<MultiFab>());

    const int ncomp = getNComp();
    const int finest_amr_lev = NAMRLevels() - 1;

    nodalSync(finest_amr_lev, 0, sol[finest_amr_lev].get<MultiFab>());

    for (int falev = finest_amr_lev; falev > 0; --falev)
    {
        const auto& fmf = sol[falev  ].get<MultiFab>();
        auto&       cmf = sol[falev-1].get<MultiFab>();

        auto rr = AMRRefRatio(falev-1);
        MultiFab tmpmf(amrex::coarsen(fmf.boxArray(), rr), fmf.DistributionMap(), ncomp, 0);
        amrex::average_down(fmf, tmpmf, 0, ncomp, rr);
        cmf.ParallelCopy(tmpmf, 0, 0, ncomp);
        nodalSync(falev-1, 0, cmf);
    }
}